

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O2

wchar_t path_nearest_unknown(player *p,loc start,loc *dest_grid,int16_t **step_dirs)

{
  loc_conflict grid1;
  loc grid;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  loc *plVar4;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t wVar7;
  wchar_t wVar8;
  loc lVar9;
  long lVar10;
  long lVar11;
  chunk_conflict2 *c;
  long lVar12;
  _Bool local_6e;
  wchar_t local_6c;
  pfdistances *local_68;
  loc local_58;
  loc local_50;
  loc *local_48;
  int16_t **local_40;
  long local_38;
  
  local_6e = true;
  _Var6 = true;
  local_48 = dest_grid;
  local_40 = step_dirs;
  bVar2 = true;
  do {
    local_50 = (loc)loc(-1,-1);
    c = p->cave;
    local_6c = L'\x7fffffff';
    lVar12 = 0;
    local_68 = (pfdistances *)0x0;
    lVar10 = 0;
    while (lVar9 = local_50, lVar10 < c->height) {
      local_38 = lVar10;
      for (lVar11 = 0; lVar11 < c->width; lVar11 = lVar11 + 1) {
        lVar9 = (loc)(lVar12 + lVar11);
        _Var5 = loc_eq((loc_conflict)lVar9,(loc_conflict)start);
        wVar8 = local_6c;
        grid = local_50;
        if ((!_Var5) &&
           (_Var5 = square_isknown((chunk_conflict *)p->cave,lVar9), grid = local_50, _Var5)) {
          if (bVar2) {
            _Var5 = square_ispassable((chunk_conflict *)p->cave,lVar9);
            grid = local_50;
            if ((_Var5) &&
               (wVar7 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,lVar9,square_isknown,
                                        false), grid = local_50, wVar7 != L'\b')) {
              local_58.x = (wchar_t)lVar11;
              local_58.y = (wchar_t)local_38;
LAB_001aebaa:
              if (local_68 == (pfdistances *)0x0) {
                local_68 = prepare_pfdistances(p,start,_Var6,local_6e);
              }
              grid.y = local_58.y;
              grid.x = local_58.x;
              wVar8 = pfdistances_to_turncount(local_68,grid);
              if (wVar8 < L'\x01' || local_6c <= wVar8) {
                wVar8 = local_6c;
                grid = local_50;
              }
            }
          }
          else {
            _Var5 = square_iscloseddoor((chunk_conflict *)p->cave,lVar9);
            if ((((_Var5) ||
                 (_Var5 = square_isrubble((chunk_conflict *)p->cave,lVar9), grid = local_50, _Var5))
                && (wVar7 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,lVar9,
                                            square_isknown,false), grid = local_50, wVar7 != L'\b'))
               && ((wVar7 = count_neighbors(&local_58,(chunk_conflict *)p->cave,lVar9,
                                            square_isknownpassable,false), grid = local_50,
                   wVar7 != L'\0' &&
                   (grid1.y = local_58.y, grid1.x = local_58.x,
                   _Var5 = loc_eq(grid1,(loc_conflict)start), grid = local_50, !_Var5))))
            goto LAB_001aebaa;
          }
        }
        local_50 = grid;
        local_6c = wVar8;
        c = p->cave;
      }
      lVar12 = lVar12 + 0x100000000;
      lVar10 = local_38 + 1;
    }
    if (local_6c != L'\x7fffffff') {
      if ((local_68 == (pfdistances *)0x0) ||
         (_Var6 = square_in_bounds((chunk_conflict *)c,local_50), !_Var6)) {
        __assert_fail("distances && square_in_bounds(p->cave, min_grid)",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                      ,0x410,
                      "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                     );
      }
      if (local_48 != (loc *)0x0) {
        *local_48 = lVar9;
      }
      wVar8 = pfdistances_to_path(local_68,lVar9,local_40);
      release_pfdistances(local_68);
      if (L'\0' < wVar8) {
        return wVar8;
      }
      __assert_fail("path_length > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                    ,0x417,
                    "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                   );
    }
    release_pfdistances(local_68);
    bVar3 = bVar2;
    if (local_6e == false) {
      if (_Var6 == false) {
        bVar3 = false;
      }
      local_6e = true;
      _Var5 = _Var6;
      _Var6 = (_Bool)(~_Var6 & 1);
    }
    else {
      local_6e = player_is_trapsafe(p);
      _Var5 = (_Bool)(!local_6e | _Var6);
      if (local_6e && _Var6 == false) {
        bVar3 = false;
      }
      if (local_6e) {
        _Var6 = (_Bool)(~_Var6 & 1);
      }
    }
    plVar4 = local_48;
    bVar1 = !bVar2;
    bVar2 = bVar3;
    if (bVar1 && _Var5 == false) {
      if (local_48 != (loc *)0x0) {
        lVar9 = (loc)loc(-1,-1);
        *plVar4 = lVar9;
      }
      if (local_40 != (int16_t **)0x0) {
        *local_40 = (int16_t *)0x0;
      }
      return L'\xffffffff';
    }
  } while( true );
}

Assistant:

int path_nearest_unknown(struct player *p, struct loc start,
		struct loc *dest_grid, int16_t **step_dirs)
{
	bool only_known = true, forbid_traps = true, passable = true;

	while (1) {
		struct pfdistances *distances = NULL;
		struct loc min_grid = loc(-1, -1);
		int min_turns = INT_MAX;
		struct loc grid;

		for (grid.y = 0; grid.y < p->cave->height; ++grid.y) {
			for (grid.x = 0; grid.x < p->cave->width; ++grid.x) {
				struct loc test_grid;
				int turns;

				if (loc_eq(grid, start)
						|| !square_isknown(p->cave,
						grid)) {
					continue;
				}
				if (passable) {
					if (!square_ispassable(p->cave, grid)
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown, false)
							== 8) {
						continue;
					}
					test_grid = grid;
				} else {
					if ((!square_iscloseddoor(p->cave, grid)
							&& !square_isrubble(
							p->cave, grid))
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown,
							false) == 8) {
						continue;
					}
					if (count_neighbors(&test_grid,
							p->cave, grid,
							square_isknownpassable,
							false) == 0 ||
							loc_eq(test_grid,
							start)) {
						continue;
					}
				}

				if (!distances) {
					distances = prepare_pfdistances(
						p, start, only_known,
						forbid_traps);
				}
				turns = pfdistances_to_turncount(distances,
					test_grid);
				if (turns > 0 && min_turns > turns) {
					min_turns = turns;
					min_grid = test_grid;
				}
			}
		}

		if (min_turns < INT_MAX) {
			int path_length;

			assert(distances
				&& square_in_bounds(p->cave, min_grid));
			if (dest_grid) {
				*dest_grid = min_grid;
			}
			path_length = pfdistances_to_path(distances,
				min_grid, step_dirs);
			release_pfdistances(distances);
			assert(path_length > 0);
			return path_length;
		}

		release_pfdistances(distances);
		/*
		 * No destination was found.  Try looser constraints on the
		 * grids that can be in the path.
		 */
		if (forbid_traps && !player_is_trapsafe(p)) {
			forbid_traps = false;
			continue;
		}
		if (only_known) {
			only_known = false;
			forbid_traps = true;
			continue;
		}
		/*
		 * Looser constraints did not help.  Try looking for known
		 * closed doors or known rubble with unknown neighbors.
		 */
		if (passable) {
			passable = false;
			only_known = true;
			forbid_traps = true;
			continue;
		}
		/* Nothing more to try.  Give up. */
		if (dest_grid) {
			*dest_grid = loc(-1, -1);
		}
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
}